

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membervariable.cpp
# Opt level: O2

MemberVariable * __thiscall
cppgenerate::MemberVariable::operator=(MemberVariable *this,MemberVariable *other)

{
  if (this != other) {
    Variable::operator=(&this->super_Variable,&other->super_Variable);
    this->m_access = other->m_access;
    this->m_generateGetter = other->m_generateGetter;
    this->m_generateSetter = other->m_generateSetter;
    this->m_isQProperty = other->m_isQProperty;
    std::__cxx11::string::_M_assign((string *)&this->m_changedSignalName);
  }
  return this;
}

Assistant:

MemberVariable& MemberVariable::operator=( const MemberVariable& other ){
    if( this != &other ){
        Variable::operator=( other );
        m_access = other.m_access;
        m_generateGetter = other.m_generateGetter;
        m_generateSetter = other.m_generateSetter;
        m_isQProperty = other.m_isQProperty;
        m_changedSignalName = other.m_changedSignalName;
    }

    return *this;
}